

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

TreeNode * si9ma::BinaryTree::get_next(TreeNode *head)

{
  TreeNode *pTVar1;
  bool bVar2;
  
  if (head == (TreeNode *)0x0) {
LAB_00108d6c:
    pTVar1 = (TreeNode *)0x0;
  }
  else {
    if (head->right != (TreeNode *)0x0) {
      pTVar1 = get_left_most(head->right);
      return pTVar1;
    }
    do {
      pTVar1 = head->parent;
      if (pTVar1 == (TreeNode *)0x0) goto LAB_00108d6c;
      bVar2 = pTVar1->left != head;
      head = pTVar1;
    } while (bVar2);
  }
  return pTVar1;
}

Assistant:

const TreeNode* BinaryTree::get_next(const TreeNode *head) {
        if (head == nullptr)
            return head;

        if (head->right != nullptr)
            return get_left_most(head->right);
        else{
            auto *cur = head;
            auto *parent = head->parent;

            while (parent != nullptr && parent->left != cur){
                cur = parent;
                parent = parent->parent;
            }

            return parent;
        }
    }